

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int compareFiles(char *r1,char *r2)

{
  char cVar1;
  int __fd;
  int __fd_00;
  int iVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char bytes1 [4096];
  char bytes2 [4096];
  
  cVar1 = update_results;
  __fd = open64(r1,0);
  if (cVar1 == '\x01') {
    iVar2 = -1;
    if (__fd < 0) {
      return -1;
    }
    iVar7 = 0;
    __fd_00 = open64(r2,0x241,0x1a4);
    if (-1 < __fd_00) {
      do {
        sVar3 = read(__fd,bytes1,0x1000);
        uVar5 = (uint)sVar3;
        if ((int)uVar5 < 1) goto LAB_0010bf0e;
        sVar3 = write(__fd_00,bytes1,(ulong)(uVar5 & 0x7fffffff));
        iVar7 = iVar7 + uVar5;
      } while ((uint)sVar3 == uVar5);
      iVar7 = 1;
LAB_0010bf0e:
      close(__fd_00);
      close(__fd);
      if (iVar7 == 0) {
        unlink(r2);
      }
      return (uint)(uVar5 != 0);
    }
  }
  else {
    if (__fd < 0) {
      return -1;
    }
    iVar7 = open64(r2,0);
    do {
      sVar3 = read(__fd,bytes1,0x1000);
      uVar5 = 0;
      if (-1 < iVar7) {
        sVar4 = read(iVar7,bytes2,0x1000);
        uVar5 = (uint)sVar4;
      }
      uVar6 = (uint)sVar3;
      if (((int)uVar6 < 0) || (uVar5 != uVar6)) break;
      if (uVar6 == 0) {
        close(__fd);
        iVar2 = 0;
        goto LAB_0010bfc8;
      }
      iVar2 = bcmp(bytes1,bytes2,(ulong)(uVar6 & 0x7fffffff));
    } while (iVar2 == 0);
    close(__fd);
    iVar2 = 1;
LAB_0010bfc8:
    __fd = iVar7;
    if (iVar7 < 0) {
      return iVar2;
    }
  }
  close(__fd);
  return iVar2;
}

Assistant:

static int compareFiles(const char *r1 /* temp */, const char *r2 /* result */) {
    int res1, res2, total;
    int fd1, fd2;
    char bytes1[4096];
    char bytes2[4096];

    if (update_results) {
        fd1 = open(r1, RD_FLAGS);
        if (fd1 < 0)
            return(-1);
        fd2 = open(r2, WR_FLAGS, 0644);
        if (fd2 < 0) {
            close(fd1);
            return(-1);
        }
        total = 0;
        do {
            res1 = read(fd1, bytes1, 4096);
            if (res1 <= 0)
                break;
            total += res1;
            res2 = write(fd2, bytes1, res1);
            if (res2 <= 0 || res2 != res1)
                break;
        } while (1);
        close(fd2);
        close(fd1);
        if (total == 0)
            unlink(r2);
        return(res1 != 0);
    }

    fd1 = open(r1, RD_FLAGS);
    if (fd1 < 0)
        return(-1);
    fd2 = open(r2, RD_FLAGS);
    while (1) {
        res1 = read(fd1, bytes1, 4096);
        res2 = fd2 >= 0 ? read(fd2, bytes2, 4096) : 0;
	if ((res1 != res2) || (res1 < 0)) {
	    close(fd1);
            if (fd2 >= 0)
                close(fd2);
	    return(1);
	}
	if (res1 == 0)
	    break;
	if (memcmp(bytes1, bytes2, res1) != 0) {
	    close(fd1);
            if (fd2 >= 0)
                close(fd2);
	    return(1);
	}
    }
    close(fd1);
    if (fd2 >= 0)
        close(fd2);
    return(0);
}